

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O3

in_addr_t ngx_inet_addr(u_char *text,size_t len)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  
  if (0 < (long)len) {
    pbVar6 = text + len;
    lVar3 = 0;
    uVar5 = 0;
    iVar4 = 0;
    do {
      bVar1 = *text;
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar5 = (ulong)(bVar1 & 0xf) + uVar5 * 10;
        if (0xff < uVar5) {
          return 0xffffffff;
        }
      }
      else {
        if (bVar1 != 0x2e) {
          return 0xffffffff;
        }
        iVar4 = (int)uVar5 + iVar4 * 0x100;
        lVar3 = lVar3 + 1;
        uVar5 = 0;
      }
      text = text + 1;
    } while (text < pbVar6);
    if (lVar3 == 3) {
      uVar2 = iVar4 << 8 | (uint)uVar5;
      return uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | (uint)uVar5 << 0x18;
    }
  }
  return 0xffffffff;
}

Assistant:

in_addr_t
ngx_inet_addr(u_char *text, size_t len)
{
    u_char      *p, c;
    in_addr_t    addr;
    ngx_uint_t   octet, n;

    addr = 0;
    octet = 0;
    n = 0;

    for (p = text; p < text + len; p++) {
        c = *p;

        if (c >= '0' && c <= '9') {
            octet = octet * 10 + (c - '0');

            if (octet > 255) {
                return INADDR_NONE;
            }

            continue;
        }

        if (c == '.') {
            addr = (addr << 8) + octet;
            octet = 0;
            n++;
            continue;
        }

        return INADDR_NONE;
    }

    if (n == 3) {
        addr = (addr << 8) + octet;
        return htonl(addr);
    }

    return INADDR_NONE;
}